

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecUtil.c
# Opt level: O1

void Gia_PolynCollectXors_rec(Gia_Man_t *pGia,int iObj,Vec_Int_t *vXors)

{
  Gia_Obj_t *pGVar1;
  undefined8 uVar2;
  uint uVar3;
  long lVar4;
  
  if ((iObj < 0) || (pGia->nObjs <= iObj)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  if (pGia->nTravIdsAlloc <= iObj) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x263,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (pGia->pTravIds[(uint)iObj] != pGia->nTravIds) {
    pGVar1 = pGia->pObjs;
    pGia->pTravIds[(uint)iObj] = pGia->nTravIds;
    uVar2 = *(undefined8 *)(pGVar1 + (uint)iObj);
    uVar3 = (uint)uVar2;
    if (((~uVar3 & 0x1fffffff) != 0 && -1 < (int)uVar3) &&
       ((uVar3 & 0x1fffffff) < ((uint)((ulong)uVar2 >> 0x20) & 0x1fffffff))) {
      if (pGia->nObjs <= iObj) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      if (pGia->pRefs[(uint)iObj] < 2) {
        Gia_PolynCollectXors_rec(pGia,iObj - (uVar3 & 0x1fffffff),vXors);
        Gia_PolynCollectXors_rec
                  (pGia,iObj - (*(uint *)&pGVar1[(uint)iObj].field_0x4 & 0x1fffffff),vXors);
        if (0 < (long)vXors->nSize) {
          lVar4 = 0;
          do {
            if (vXors->pArray[lVar4] == iObj) {
              return;
            }
            lVar4 = lVar4 + 1;
          } while (vXors->nSize != lVar4);
        }
        Vec_IntPush(vXors,iObj);
        return;
      }
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Gia_PolynCollectXors_rec( Gia_Man_t * pGia, int iObj, Vec_Int_t * vXors )
{
    Gia_Obj_t * pObj = Gia_ManObj( pGia, iObj );
    if ( Gia_ObjIsTravIdCurrent(pGia, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(pGia, pObj);
    if ( !Gia_ObjIsAnd(pObj) || !Gia_ObjIsXor(pObj) || Gia_ObjRefNum(pGia, pObj) > 1 )
        return;
    Gia_PolynCollectXors_rec( pGia, Gia_ObjFaninId0(pObj, iObj), vXors );
    Gia_PolynCollectXors_rec( pGia, Gia_ObjFaninId1(pObj, iObj), vXors );
    Vec_IntPushUnique( vXors, iObj );
}